

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_copy_database.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::BindCopyDatabaseSchema
          (Binder *this,Catalog *from_database,string *target_database_name)

{
  char cVar1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  pointer pCVar3;
  create_info_set_t *pcVar4;
  pointer pCVar5;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  __node_base *p_Var6;
  pointer prVar7;
  catalog_entry_vector_t catalog_entries;
  LogicalDependencyList altered_dependencies;
  value_type altered_dep;
  _Head_base<0UL,_duckdb::CopyDatabaseInfo_*,_false> local_118;
  _Head_base<0UL,_duckdb::CreateInfo_*,_false> local_110;
  _Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  local_108;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_e8;
  pointer local_e0;
  pointer local_d8;
  _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_d0;
  undefined1 local_98 [104];
  
  local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PhysicalExport::GetNaiveExportOrder
            ((catalog_entry_vector_t *)local_98,
             (ClientContext *)(from_database->default_table)._M_dataplus._M_p,
             (Catalog *)target_database_name);
  local_e8._M_head_impl = (LogicalOperator *)this;
  ::std::
  vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ::_M_move_assign((vector<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                    *)&local_108,
                   (_Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                    *)local_98);
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ::~_Vector_base((_Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
                   *)local_98);
  make_uniq<duckdb::CopyDatabaseInfo,std::__cxx11::string_const&>
            ((duckdb *)&local_118,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71(in_register_00000009,in_CL));
  local_e0 = local_108._M_impl.super__Vector_impl_data._M_finish;
  prVar7 = local_108._M_impl.super__Vector_impl_data._M_start;
  while (prVar7 != local_e0) {
    (*prVar7->_M_data->_vptr_CatalogEntry[8])(&local_110);
    pCVar3 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                         *)&local_110);
    ::std::__cxx11::string::_M_assign((string *)&pCVar3->catalog);
    local_d8 = prVar7;
    pCVar3 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                         *)&local_110);
    cVar1 = (pCVar3->super_ParseInfo).field_0x9;
    local_d0._M_buckets = &local_d0._M_single_bucket;
    local_d0._M_bucket_count = 1;
    local_d0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_d0._M_element_count = 0;
    local_d0._M_rehash_policy._M_max_load_factor = 1.0;
    local_d0._M_rehash_policy._M_next_resize = 0;
    local_d0._M_single_bucket = (__node_base_ptr)0x0;
    pCVar3 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                         *)&local_110);
    pcVar4 = LogicalDependencyList::Set(&pCVar3->dependencies);
    p_Var6 = &(pcVar4->_M_h)._M_before_begin;
    while (p_Var6 = p_Var6->_M_nxt, p_Var6 != (__node_base *)0x0) {
      LogicalDependency::LogicalDependency
                ((LogicalDependency *)local_98,(LogicalDependency *)(p_Var6 + 1));
      ::std::__cxx11::string::_M_assign((string *)(local_98 + 0x48));
      LogicalDependencyList::AddDependency
                ((LogicalDependencyList *)&local_d0,(LogicalDependency *)local_98);
      LogicalDependency::~LogicalDependency((LogicalDependency *)local_98);
    }
    pCVar3 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                         *)&local_110);
    ::std::
    _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::operator=((_Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&pCVar3->dependencies,&local_d0);
    pCVar3 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->((unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                         *)&local_110);
    pCVar3->on_conflict = cVar1 == '\x02';
    pCVar5 = unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
             ::operator->((unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
                           *)&local_118);
    ::std::
    vector<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>
              ((vector<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>,std::allocator<duckdb::unique_ptr<duckdb::CreateInfo,std::default_delete<duckdb::CreateInfo>,true>>>
                *)&pCVar5->entries,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               &local_110);
    ::std::
    _Hashtable<duckdb::LogicalDependency,_duckdb::LogicalDependency,_std::allocator<duckdb::LogicalDependency>,_std::__detail::_Identity,_duckdb::LogicalDependencyEquality,_duckdb::LogicalDependencyHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_d0);
    if (local_110._M_head_impl != (CreateInfo *)0x0) {
      (*((local_110._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
    }
    prVar7 = local_d8 + 1;
  }
  make_uniq<duckdb::LogicalCopyDatabase,duckdb::unique_ptr<duckdb::CopyDatabaseInfo,std::default_delete<duckdb::CopyDatabaseInfo>,true>>
            ((duckdb *)local_98,
             (unique_ptr<duckdb::CopyDatabaseInfo,_std::default_delete<duckdb::CopyDatabaseInfo>,_true>
              *)&local_118);
  _Var2._M_head_impl = local_e8._M_head_impl;
  (local_e8._M_head_impl)->_vptr_LogicalOperator = (_func_int **)local_98._0_8_;
  if (local_118._M_head_impl != (CopyDatabaseInfo *)0x0) {
    (*((local_118._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  ::std::
  _Vector_base<std::reference_wrapper<duckdb::CatalogEntry>,_std::allocator<std::reference_wrapper<duckdb::CatalogEntry>_>_>
  ::~_Vector_base(&local_108);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         _Var2._M_head_impl;
}

Assistant:

unique_ptr<LogicalOperator> Binder::BindCopyDatabaseSchema(Catalog &from_database, const string &target_database_name) {

	catalog_entry_vector_t catalog_entries;
	catalog_entries = PhysicalExport::GetNaiveExportOrder(context, from_database);

	auto info = make_uniq<CopyDatabaseInfo>(target_database_name);
	for (auto &entry : catalog_entries) {
		auto create_info = entry.get().GetInfo();
		create_info->catalog = target_database_name;
		auto on_conflict = create_info->type == CatalogType::SCHEMA_ENTRY ? OnCreateConflict::IGNORE_ON_CONFLICT
		                                                                  : OnCreateConflict::ERROR_ON_CONFLICT;
		// Update all the dependencies of the entry to point to the newly created entries on the target database
		LogicalDependencyList altered_dependencies;
		for (auto &dep : create_info->dependencies.Set()) {
			auto altered_dep = dep;
			altered_dep.catalog = target_database_name;
			altered_dependencies.AddDependency(altered_dep);
		}
		create_info->dependencies = altered_dependencies;
		create_info->on_conflict = on_conflict;
		info->entries.push_back(std::move(create_info));
	}

	return make_uniq<LogicalCopyDatabase>(std::move(info));
}